

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yyrefill(GREG *G)

{
  int iVar1;
  PVIPParserStringState *pPVar2;
  int iVar3;
  char *__ptr;
  int iVar4;
  
  iVar3 = G->buflen;
  iVar1 = G->pos;
  __ptr = G->buf;
  iVar4 = iVar3 - iVar1;
  while (iVar4 < 0x200) {
    G->buflen = iVar3 * 2;
    __ptr = (char *)realloc(__ptr,(long)(iVar3 * 2));
    G->buf = __ptr;
    iVar3 = G->buflen;
    iVar1 = G->pos;
    iVar4 = iVar3 - iVar1;
  }
  if ((G->data).is_string == 0) {
    iVar3 = fgetc((FILE *)(G->data).fp);
    __ptr[iVar1] = (char)iVar3;
    if ((char)iVar3 == -1) {
      return 0;
    }
  }
  else {
    pPVar2 = (G->data).str;
    if (pPVar2->len == pPVar2->pos) {
      return 0;
    }
    __ptr[iVar1] = pPVar2->buf[pPVar2->pos];
    pPVar2->pos = pPVar2->pos + 1;
  }
  G->limit = G->limit + 1;
  return 1;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}